

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_buf_slot.cpp
# Opt level: O1

void slot_ops_with_log(MppBufSlotsImpl *impl,MppBufSlotEntry *slot,MppBufSlotOps op,void *arg)

{
  ushort uVar1;
  undefined2 uVar2;
  uint uVar3;
  uint uVar4;
  MppBufSlotLogs *pMVar5;
  MppBufSlotLog *pMVar6;
  bool bVar7;
  uint uVar8;
  char *fmt;
  ushort uVar9;
  ushort uVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  
  uVar3 = (slot->status).val;
  uVar4 = slot->index;
  uVar11 = (ulong)uVar4;
  bVar7 = true;
  uVar13 = uVar11;
  switch((ulong)op) {
  case 0:
    uVar13 = (ulong)op;
    break;
  case 1:
    uVar13 = (ulong)(uVar3 | 1);
    break;
  case 2:
    uVar13 = (ulong)(uVar3 & 0xfffffffe);
    break;
  case 3:
  case 6:
    uVar13 = (ulong)(uVar3 | 2);
    break;
  case 4:
  case 5:
    uVar13 = (ulong)(uVar3 & 0xfffffffd);
    break;
  case 7:
    uVar13 = (ulong)(uVar3 | 4);
    break;
  case 8:
    uVar13 = (ulong)(uVar3 & 0xfffffffb);
    break;
  case 9:
    uVar8 = uVar3 + 0x20 & 0x1fe0;
    uVar12 = uVar3 & 0xffffe01f;
    goto LAB_00157a89;
  case 10:
    if ((uVar3 & 0x1fe0) != 0) {
      uVar8 = uVar3 + 0x1fe0 & 0x1fe0;
      uVar12 = uVar3 & 0xffffe01f;
LAB_00157aaf:
      uVar13 = (ulong)(uVar12 | uVar8);
      break;
    }
    fmt = "can not clr hal_input on slot %d\n";
    goto LAB_00157c00;
  case 0xb:
    uVar13 = (ulong)((uVar3 & 0xffffffe5) + (uVar3 + 8 & 0x18) + 2);
    break;
  case 0xc:
    if ((uVar3 & 0x18) == 0) {
      _mpp_log_l(2,"mpp_buf_slot","can not clr hal_output on slot %d\n",(char *)0x0,uVar11,uVar11,
                 arg);
      uVar8 = uVar3;
    }
    else {
      uVar8 = uVar3 & 0xffffffe7 | uVar3 + 0x18 & 0x18;
    }
    bVar7 = true;
    uVar13 = (ulong)(uVar8 & 0xffffffe5);
    if ((uVar8 & 0x18) != 0) {
      uVar13 = (ulong)uVar8;
    }
    break;
  case 0xd:
  case 0xf:
  case 0x10:
  case 0x11:
  case 0x12:
    uVar8 = uVar3 + 0x2000 & 0x3e000;
    uVar12 = uVar3 & 0xfffc1fff;
    goto LAB_00157a89;
  case 0xe:
  case 0x13:
  case 0x14:
  case 0x15:
  case 0x16:
    if ((uVar3 & 0x3e000) != 0) {
      uVar8 = uVar3 + 0x3e000 & 0x3e000;
      uVar12 = uVar3 & 0xfffc1fff;
      goto LAB_00157aaf;
    }
    fmt = "can not clr queue_use on slot %d\n";
    goto LAB_00157c00;
  case 0x17:
    uVar13 = (ulong)(uVar3 | 0x40000);
    break;
  case 0x18:
    uVar13 = (ulong)(uVar3 & 0xfffbffff);
    slot->eos = 0;
    break;
  case 0x19:
    uVar8 = (uint)(arg != (void *)0x0) << 0x14;
    uVar12 = uVar3 & 0xffefffff;
    goto LAB_00157a89;
  case 0x1a:
    uVar13 = (ulong)(uVar3 & 0xffefffff);
    break;
  case 0x1b:
    uVar8 = (uint)(arg != (void *)0x0) << 0x13;
    uVar12 = uVar3 & 0xfff7ffff;
LAB_00157a89:
    uVar13 = (ulong)(uVar12 | uVar8);
    break;
  case 0x1c:
    uVar13 = (ulong)(uVar3 & 0xfff7ffff);
    break;
  default:
    fmt = "found invalid operation code %d\n";
    uVar13 = (ulong)op;
LAB_00157c00:
    _mpp_log_l(2,"mpp_buf_slot",fmt,(char *)0x0,uVar13,uVar11,arg);
    bVar7 = false;
    uVar13 = (ulong)uVar3;
  }
  (slot->status).val = (RK_U32)uVar13;
  if (((byte)buf_slot_debug & 0x10) != 0) {
    _mpp_log_l(4,"mpp_buf_slot","slot %3d index %2d op: %s arg %010p status in %08x out %08x",
               (char *)0x0,(ulong)impl->slots_idx,uVar11,op_string + op,arg,(ulong)uVar3,uVar13);
  }
  pMVar5 = impl->logs;
  if (pMVar5 != (MppBufSlotLogs *)0x0) {
    pMVar6 = pMVar5->logs;
    uVar1 = pMVar5->log_write;
    pMVar6[uVar1].index = uVar4;
    pMVar6[uVar1].ops = op;
    pMVar6[uVar1].status_in.val = uVar3;
    pMVar6[uVar1].status_out.val = (RK_U32)uVar13;
    uVar2 = pMVar5->log_write;
    uVar10 = uVar2 + 1;
    uVar1 = pMVar5->max_count;
    if (uVar1 <= uVar10) {
      uVar10 = 0;
    }
    pMVar5->log_write = uVar10;
    if (pMVar5->log_count < uVar1) {
      pMVar5->log_count = pMVar5->log_count + 1;
    }
    else {
      uVar9 = pMVar5->log_read + 1;
      uVar10 = 0;
      if (uVar9 < uVar1) {
        uVar10 = uVar9;
      }
      pMVar5->log_read = uVar10;
    }
  }
  if (!bVar7) {
    _dump_slots("slot_ops_with_log",impl);
    return;
  }
  return;
}

Assistant:

static void slot_ops_with_log(MppBufSlotsImpl *impl, MppBufSlotEntry *slot, MppBufSlotOps op, void *arg)
{
    RK_U32 error = 0;
    RK_S32 index = slot->index;
    SlotStatus status = slot->status;
    SlotStatus before = status;
    switch (op) {
    case SLOT_INIT : {
        status.val = 0;
    } break;
    case SLOT_SET_ON_USE : {
        status.on_used = 1;
    } break;
    case SLOT_CLR_ON_USE : {
        status.on_used = 0;
    } break;
    case SLOT_SET_NOT_READY : {
        status.not_ready = 1;
    } break;
    case SLOT_CLR_NOT_READY : {
        status.not_ready = 0;
    } break;
    case SLOT_SET_CODEC_READY : {
        status.not_ready = 0;
    } break;
    case SLOT_CLR_CODEC_READY : {
        status.not_ready = 1;
    } break;
    case SLOT_SET_CODEC_USE : {
        status.codec_use = 1;
    } break;
    case SLOT_CLR_CODEC_USE : {
        status.codec_use = 0;
    } break;
    case SLOT_SET_HAL_INPUT : {
        status.hal_use++;
    } break;
    case SLOT_CLR_HAL_INPUT : {
        if (status.hal_use)
            status.hal_use--;
        else {
            mpp_err("can not clr hal_input on slot %d\n", slot->index);
            error = 1;
        }
    } break;
    case SLOT_SET_HAL_OUTPUT : {
        status.hal_output++;
        status.not_ready  = 1;
    } break;
    case SLOT_CLR_HAL_OUTPUT : {
        if (status.hal_output)
            status.hal_output--;
        else
            mpp_err("can not clr hal_output on slot %d\n", slot->index);

        // NOTE: set output index ready here
        if (!status.hal_output)
            status.not_ready  = 0;
    } break;
    case SLOT_SET_QUEUE_USE :
    case SLOT_ENQUEUE_OUTPUT :
    case SLOT_ENQUEUE_DISPLAY :
    case SLOT_ENQUEUE_DEINTER :
    case SLOT_ENQUEUE_CONVERT : {
        status.queue_use++;
    } break;
    case SLOT_CLR_QUEUE_USE :
    case SLOT_DEQUEUE_OUTPUT :
    case SLOT_DEQUEUE_DISPLAY :
    case SLOT_DEQUEUE_DEINTER :
    case SLOT_DEQUEUE_CONVERT : {
        if (status.queue_use)
            status.queue_use--;
        else {
            mpp_err("can not clr queue_use on slot %d\n", slot->index);
            error = 1;
        }
    } break;
    case SLOT_SET_EOS : {
        status.eos = 1;
    } break;
    case SLOT_CLR_EOS : {
        status.eos = 0;
        slot->eos = 0;
    } break;
    case SLOT_SET_FRAME : {
        status.has_frame = (arg) ? (1) : (0);
    } break;
    case SLOT_CLR_FRAME : {
        status.has_frame = 0;
    } break;
    case SLOT_SET_BUFFER : {
        status.has_buffer = (arg) ? (1) : (0);
    } break;
    case SLOT_CLR_BUFFER : {
        status.has_buffer = 0;
    } break;
    default : {
        mpp_err("found invalid operation code %d\n", op);
        error = 1;
    } break;
    }
    slot->status = status;
    buf_slot_dbg(BUF_SLOT_DBG_OPS_RUNTIME, "slot %3d index %2d op: %s arg %010p status in %08x out %08x",
                 impl->slots_idx, index, op_string[op], arg, before.val, status.val);
    if (impl->logs)
        buf_slot_logs_write(impl->logs, index, op, before, status);
    if (error)
        dump_slots(impl);
}